

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemengine_unix.cpp
# Opt level: O0

QFileSystemEntry * QFileSystemEngine::absoluteName(QFileSystemEntry *entry)

{
  bool bVar1;
  byte bVar2;
  int *piVar3;
  qsizetype qVar4;
  char *pcVar5;
  undefined8 in_RSI;
  QFileSystemEntry *in_RDI;
  long in_FS_OFFSET;
  bool isDir;
  QString stringVersion;
  QByteArray result;
  QByteArray orig;
  QFileSystemEntry resultingEntry;
  QFileSystemEntry cur;
  QFileSystemEntry *this;
  undefined7 in_stack_fffffffffffffea8;
  undefined1 in_stack_fffffffffffffeaf;
  undefined4 in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb4;
  QChar ch;
  QChar local_132;
  QFileSystemEntry *in_stack_fffffffffffffed0;
  QByteArray local_e8;
  QByteArray local_d0 [3];
  undefined1 local_78 [56];
  undefined1 local_40 [56];
  long local_8;
  
  ch.ucs = (char16_t)((ulong)in_RSI >> 0x30);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this = in_RDI;
  bVar1 = QFileSystemEntry::isEmpty(in_RDI);
  if (bVar1) {
    piVar3 = __errno_location();
    *piVar3 = 0x16;
    QFileSystemEntry::QFileSystemEntry(this,in_RDI);
  }
  else {
    bVar1 = qIsFilenameBroken(this);
    if (bVar1) {
      piVar3 = __errno_location();
      *piVar3 = 0x16;
      QFileSystemEntry::QFileSystemEntry(this,in_RDI);
    }
    else {
      bVar1 = QFileSystemEntry::isAbsolute
                        ((QFileSystemEntry *)
                         CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
      if ((bVar1) && (bVar1 = QFileSystemEntry::isClean(in_stack_fffffffffffffed0), bVar1)) {
        QFileSystemEntry::QFileSystemEntry(this,in_RDI);
      }
      else {
        local_d0[0].d.d = (Data *)0xaaaaaaaaaaaaaaaa;
        local_d0[0].d.ptr = (char *)0xaaaaaaaaaaaaaaaa;
        local_d0[0].d.size = -0x5555555555555556;
        QFileSystemEntry::nativeFilePath
                  ((QFileSystemEntry *)CONCAT17(in_stack_fffffffffffffeaf,in_stack_fffffffffffffea8)
                  );
        local_e8.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
        local_e8.d.ptr = (char *)0xaaaaaaaaaaaaaaaa;
        local_e8.d.size = -0x5555555555555556;
        QByteArray::QByteArray((QByteArray *)0x1794f2);
        bVar1 = QByteArray::isEmpty((QByteArray *)0x1794ff);
        if ((bVar1) ||
           (bVar1 = QByteArray::startsWith((QByteArray *)this,(char)((ulong)in_RDI >> 0x38)), !bVar1
           )) {
          memset(local_40,0xaa,0x38);
          currentPath();
          QFileSystemEntry::nativeFilePath
                    ((QFileSystemEntry *)
                     CONCAT17(in_stack_fffffffffffffeaf,in_stack_fffffffffffffea8));
          QByteArray::operator=((QByteArray *)this,(QByteArray *)in_RDI);
          QByteArray::~QByteArray((QByteArray *)0x17956b);
          QFileSystemEntry::~QFileSystemEntry(this);
        }
        bVar1 = QByteArray::isEmpty((QByteArray *)0x179585);
        if ((!bVar1) &&
           ((qVar4 = QByteArray::size(local_d0), qVar4 != 1 ||
            (pcVar5 = QByteArray::operator[]((QByteArray *)in_RDI,0x1795ad), *pcVar5 != '.')))) {
          bVar1 = QByteArray::isEmpty((QByteArray *)0x1795c2);
          if ((!bVar1) &&
             (bVar1 = QByteArray::endsWith((QByteArray *)this,(char)((ulong)in_RDI >> 0x38)), !bVar1
             )) {
            QByteArray::append((QByteArray *)this,(char)((ulong)in_RDI >> 0x38));
          }
          QByteArray::append((QByteArray *)
                             CONCAT17(in_stack_fffffffffffffeaf,in_stack_fffffffffffffea8),
                             (QByteArray *)this);
        }
        qVar4 = QByteArray::size(&local_e8);
        if ((qVar4 == 1) &&
           (pcVar5 = QByteArray::operator[]((QByteArray *)in_RDI,0x179627), *pcVar5 == '/')) {
          QFileSystemEntry::QFileSystemEntry
                    ((QFileSystemEntry *)
                     CONCAT17(in_stack_fffffffffffffeaf,in_stack_fffffffffffffea8),
                     (NativePath *)this,SUB41((uint)in_stack_fffffffffffffeb4 >> 0x18,0));
        }
        else {
          bVar2 = QByteArray::endsWith((QByteArray *)this,(char)((ulong)in_RDI >> 0x38));
          memset(local_78,0xaa,0x38);
          QFileSystemEntry::QFileSystemEntry
                    ((QFileSystemEntry *)CONCAT17(bVar2,in_stack_fffffffffffffea8),
                     (NativePath *)this,SUB41((uint)in_stack_fffffffffffffeb4 >> 0x18,0));
          QFileSystemEntry::filePath((QFileSystemEntry *)CONCAT17(bVar2,in_stack_fffffffffffffea8));
          QDir::cleanPath((QString *)CONCAT17(bVar2,in_stack_fffffffffffffea8));
          QString::~QString((QString *)0x1796e0);
          if ((bVar2 & 1) != 0) {
            QChar::QChar<char16_t,_true>(&local_132,L'/');
            QString::append((QString *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0)
                            ,ch);
          }
          QFileSystemEntry::QFileSystemEntry(this,&in_RDI->m_filePath);
          QString::~QString((QString *)0x179725);
          QFileSystemEntry::~QFileSystemEntry(this);
        }
        QByteArray::~QByteArray((QByteArray *)0x17973f);
        QByteArray::~QByteArray((QByteArray *)0x17974c);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

QFileSystemEntry QFileSystemEngine::absoluteName(const QFileSystemEntry &entry)
{
    Q_CHECK_FILE_NAME(entry, entry);

    if (entry.isAbsolute() && entry.isClean())
        return entry;

    QByteArray orig = entry.nativeFilePath();
    QByteArray result;
    if (orig.isEmpty() || !orig.startsWith('/')) {
        QFileSystemEntry cur(currentPath());
        result = cur.nativeFilePath();
    }
    if (!orig.isEmpty() && !(orig.size() == 1 && orig[0] == '.')) {
        if (!result.isEmpty() && !result.endsWith('/'))
            result.append('/');
        result.append(orig);
    }

    if (result.size() == 1 && result[0] == '/')
        return QFileSystemEntry(result, QFileSystemEntry::FromNativePath());
    const bool isDir = result.endsWith('/');

    /* as long as QDir::cleanPath() operates on a QString we have to convert to a string here.
     * ideally we never convert to a string since that loses information. Please fix after
     * we get a QByteArray version of QDir::cleanPath()
     */
    QFileSystemEntry resultingEntry(result, QFileSystemEntry::FromNativePath());
    QString stringVersion = QDir::cleanPath(resultingEntry.filePath());
    if (isDir)
        stringVersion.append(u'/');
    return QFileSystemEntry(stringVersion);
}